

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O0

void __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::Clear(SDES *this)

{
  SDESSource *obj;
  bool bVar1;
  reference ppSVar2;
  RTPMemoryManager *mgr;
  iterator local_38;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> local_30;
  iterator local_28;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> local_20;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> local_18;
  const_iterator it;
  SDES *this_local;
  
  it._M_node = (_List_node_base *)this;
  std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::_List_const_iterator
            (&local_18);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
       ::begin(&this->sdessources);
  std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::_List_const_iterator
            (&local_20,&local_28);
  local_18._M_node = local_20._M_node;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
         ::end(&this->sdessources);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::
    _List_const_iterator(&local_30,&local_38);
    bVar1 = std::operator!=(&local_18,&local_30);
    if (!bVar1) break;
    ppSVar2 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::operator*
                        (&local_18);
    obj = *ppSVar2;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTCPCompoundPacketBuilder::SDESSource>(obj,mgr);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::operator++
              (&local_18,0);
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
  ::clear(&this->sdessources);
  return;
}

Assistant:

void Clear()
		{
			std::list<SDESSource *>::const_iterator it;

			for (it = sdessources.begin() ; it != sdessources.end() ; it++)
				RTPDelete(*it,GetMemoryManager());
			sdessources.clear();
		}